

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

void f_parser(lua_State *L,void *ud)

{
  size_t sVar1;
  ZIO *z;
  byte *pbVar2;
  uint firstchar;
  GCObject *o;
  GCObject *v;
  ulong uVar3;
  
  z = *ud;
  sVar1 = z->n;
  z->n = z->n - 1;
  if (sVar1 == 0) {
    firstchar = luaZ_fill(z);
  }
  else {
    pbVar2 = (byte *)z->p;
    z->p = (char *)(pbVar2 + 1);
    firstchar = (uint)*pbVar2;
  }
  if (firstchar == 0x1b) {
    checkmode(L,*(char **)((long)ud + 0x50),"binary");
    o = (GCObject *)luaU_undump(L,*ud,(Mbuffer *)((long)ud + 8),*(char **)((long)ud + 0x58));
  }
  else {
    checkmode(L,*(char **)((long)ud + 0x50),"text");
    o = (GCObject *)
        luaY_parser(L,*ud,(Mbuffer *)((long)ud + 8),(Dyndata *)((long)ud + 0x20),
                    *(char **)((long)ud + 0x58),firstchar);
  }
  if ((o->h).flags != '\0') {
    uVar3 = 0;
    do {
      v = (GCObject *)luaF_newupval(L);
      *(GCObject **)((long)o + uVar3 * 8 + 0x20) = v;
      if ((((v->gch).marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
        luaC_barrier_(L,o,v);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (o->h).flags);
  }
  return;
}

Assistant:

static void f_parser (lua_State *L, void *ud) {
  int i;
  Closure *cl;
  struct SParser *p = cast(struct SParser *, ud);
  int c = zgetc(p->z);  /* read first character */
  if (c == LUA_SIGNATURE[0]) {
    checkmode(L, p->mode, "binary");
    cl = luaU_undump(L, p->z, &p->buff, p->name);
  }
  else {
    checkmode(L, p->mode, "text");
    cl = luaY_parser(L, p->z, &p->buff, &p->dyd, p->name, c);
  }
  lua_assert(cl->l.nupvalues == cl->l.p->sizeupvalues);
  for (i = 0; i < cl->l.nupvalues; i++) {  /* initialize upvalues */
    UpVal *up = luaF_newupval(L);
    cl->l.upvals[i] = up;
    luaC_objbarrier(L, cl, up);
  }
}